

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<bool>>::initialize<tinyusdz::Animatable<bool>>
          (optional<tinyusdz::Animatable<bool>> *this,Animatable<bool> *value)

{
  if (*this != (optional<tinyusdz::Animatable<bool>>)0x1) {
    tinyusdz::Animatable<bool>::Animatable((Animatable<bool> *)(this + 8),value);
    *this = (optional<tinyusdz::Animatable<bool>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<bool>>::initialize(V &&) [T = tinyusdz::Animatable<bool>, V = tinyusdz::Animatable<bool>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }